

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElKernelHDiv3D.cpp
# Opt level: O3

void __thiscall
TPZCompElKernelHDiv3D<pzshape::TPZShapePrism>::TPZCompElKernelHDiv3D
          (TPZCompElKernelHDiv3D<pzshape::TPZShapePrism> *this,TPZCompMesh *mesh,TPZGeoEl *gel,
          HDivFamily hdivfam)

{
  *(undefined ***)
   &(this->super_TPZCompElHCurl<pzshape::TPZShapePrism>).super_TPZIntelGen<pzshape::TPZShapePrism>.
    super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZSavable_01965fb0;
  TPZCompElHCurl<pzshape::TPZShapePrism>::TPZCompElHCurl
            (&this->super_TPZCompElHCurl<pzshape::TPZShapePrism>,&PTR_PTR_0195ff48,mesh,gel,
             EHCurlNoGrads);
  *(undefined ***)
   &(this->super_TPZCompElHCurl<pzshape::TPZShapePrism>).super_TPZIntelGen<pzshape::TPZShapePrism>.
    super_TPZInterpolatedElement.super_TPZInterpolationSpace.super_TPZCompEl =
       &PTR__TPZCompElKernelHDiv3D_0195fb78;
  *(HDivFamily *)&(this->super_TPZCompElHCurl<pzshape::TPZShapePrism>).field_0x10c = hdivfam;
  return;
}

Assistant:

TPZCompElKernelHDiv3D<TSHAPE>::TPZCompElKernelHDiv3D(TPZCompMesh &mesh, TPZGeoEl *gel, const HDivFamily hdivfam) :
TPZRegisterClassId(&TPZCompElKernelHDiv3D::ClassId), TPZCompElHCurl<TSHAPE>(mesh,gel,HCurlFamily::EHCurlNoGrads),
                  fhdivfam(hdivfam) {
    int firstside = TSHAPE::NSides-TSHAPE::NFacets-1;
    
    //Updates the number of shape functions and also the integration rule
    if (TSHAPE::Type() == ETetraedro || TSHAPE::Type() == ETriangle){
        for (int icon = 0; icon < this->NConnects(); icon++)
        {
            TPZConnect &c = this->Connect(icon);
            int nShapeF = NConnectShapeF(icon,c.Order());
            c.SetNShape(nShapeF);
            int64_t seqnum = c.SequenceNumber();
            int nvar = 1;
            TPZMaterial * mat = this->Material();
            if (mat) nvar = mat->NStateVariables();
            this->Mesh()->Block().Set(seqnum, nvar * nShapeF);
            this->AdjustIntegrationRule();
        }
    }
}